

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O1

PLTermBuilder __thiscall
mp::BasicExprFactory<std::allocator<char>_>::BeginPLTerm
          (BasicExprFactory<std::allocator<char>_> *this,int num_breakpoints)

{
  AssertionFailure *this_00;
  undefined8 *puVar1;
  PLTermBuilder PVar2;
  
  if (num_breakpoints < 1) {
    this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
    AssertionFailure::AssertionFailure(this_00,"invalid number of breakpoints");
    __cxa_throw(this_00,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
  }
  if ((uint)num_breakpoints < 0x8000000) {
    PVar2.impl_ = Allocate<mp::PLTerm>(this,PLTERM,num_breakpoints << 4);
    (PVar2.impl_)->num_breakpoints = num_breakpoints;
    PVar2.slope_index_ = 0;
    PVar2.breakpoint_index_ = 0;
    return PVar2;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = &PTR__exception_0019d8e0;
  __cxa_throw(puVar1,&OverflowError::typeinfo,std::exception::~exception);
}

Assistant:

PLTermBuilder BeginPLTerm(int num_breakpoints) {
    MP_ASSERT(num_breakpoints > 0, "invalid number of breakpoints");
    SafeInt<int> size = sizeof(double) * 2;
    PLTerm::Impl *impl = Allocate<PLTerm>(
          expr::PLTERM, val(size * num_breakpoints));
    impl->num_breakpoints = num_breakpoints;
    return PLTermBuilder(impl);
  }